

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void update_pub_insn(cs_insn *pub,InternalInstruction *inter,uint8_t *prefixes)

{
  x86_reg xVar1;
  undefined1 *in_RDX;
  long in_RSI;
  long in_RDI;
  
  *in_RDX = *(undefined1 *)(in_RSI + 1);
  in_RDX[1] = *(undefined1 *)(in_RSI + 2);
  in_RDX[2] = *(undefined1 *)(in_RSI + 3);
  in_RDX[3] = *(undefined1 *)(in_RSI + 4);
  if (*(int *)(in_RSI + 0xe0) == 0) {
    if (*(char *)(in_RSI + 0x80) == '\0') {
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5c) = *(undefined1 *)(in_RSI + 0xf5);
    }
    else if (*(char *)(in_RSI + 0x81) == '\0') {
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5c) = *(undefined1 *)(in_RSI + 0x80);
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5d) = *(undefined1 *)(in_RSI + 0xf5);
    }
    else {
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5c) = *(undefined1 *)(in_RSI + 0x80);
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5d) = *(undefined1 *)(in_RSI + 0x81);
      *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x5e) = *(undefined1 *)(in_RSI + 0xf5);
    }
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0xf0) + 0x5c) = *(undefined4 *)(in_RSI + 0x92);
  }
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x60) = *(undefined1 *)(in_RSI + 0x68);
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x61) = *(undefined1 *)(in_RSI + 0xf1);
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x62) = *(undefined1 *)(in_RSI + 0x71);
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x220) = *(undefined1 *)(in_RSI + 0x98);
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 99) = *(undefined1 *)(in_RSI + 0x73);
  xVar1 = x86_map_sib_index(*(int *)(in_RSI + 0x84));
  *(x86_reg *)(*(long *)(in_RDI + 0xf0) + 0x70) = xVar1;
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x74) = *(undefined1 *)(in_RSI + 0x88);
  xVar1 = x86_map_sib_base(*(int *)(in_RSI + 0x8c));
  *(x86_reg *)(*(long *)(in_RDI + 0xf0) + 0x78) = xVar1;
  *(undefined8 *)(*(long *)(in_RDI + 0xf0) + 0x68) = *(undefined8 *)(in_RSI + 0x78);
  if ((*(byte *)(in_RSI + 0x74) & 1) != 0) {
    *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x221) = *(undefined1 *)(in_RSI + 0x96);
    *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x222) = *(undefined1 *)(in_RSI + 0xf2);
  }
  *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x223) = *(undefined1 *)(in_RSI + 0x97);
  if ((*(char *)(*(long *)(in_RDI + 0xf0) + 0x224) == '\0') && (*(char *)(in_RSI + 0x97) != '\0')) {
    *(undefined1 *)(*(long *)(in_RDI + 0xf0) + 0x224) = *(undefined1 *)(in_RSI + 0xf3);
  }
  return;
}

Assistant:

static void update_pub_insn(cs_insn *pub, InternalInstruction *inter, uint8_t *prefixes)
{
	prefixes[0] = inter->prefix0;
	prefixes[1] = inter->prefix1;
	prefixes[2] = inter->prefix2;
	prefixes[3] = inter->prefix3;

	if (inter->vectorExtensionType != 0)
		memcpy(pub->detail->x86.opcode, inter->vectorExtensionPrefix, sizeof(pub->detail->x86.opcode));
	else {
		if (inter->twoByteEscape) {
			if (inter->threeByteEscape) {
				pub->detail->x86.opcode[0] = inter->twoByteEscape;
				pub->detail->x86.opcode[1] = inter->threeByteEscape;
				pub->detail->x86.opcode[2] = inter->opcode;
			} else {
				pub->detail->x86.opcode[0] = inter->twoByteEscape;
				pub->detail->x86.opcode[1] = inter->opcode;
			}
		} else {
				pub->detail->x86.opcode[0] = inter->opcode;
		}
	}

	pub->detail->x86.rex = inter->rexPrefix;

	pub->detail->x86.addr_size = inter->addressSize;

	pub->detail->x86.modrm = inter->orgModRM;
	pub->detail->x86.encoding.modrm_offset = inter->modRMOffset;

	pub->detail->x86.sib = inter->sib;
	pub->detail->x86.sib_index = x86_map_sib_index(inter->sibIndex);
	pub->detail->x86.sib_scale = inter->sibScale;
	pub->detail->x86.sib_base = x86_map_sib_base(inter->sibBase);

	pub->detail->x86.disp = inter->displacement;
	if (inter->consumedDisplacement) {
		pub->detail->x86.encoding.disp_offset = inter->displacementOffset;
		pub->detail->x86.encoding.disp_size = inter->displacementSize;
	}

	pub->detail->x86.encoding.imm_offset = inter->immediateOffset;
	if (pub->detail->x86.encoding.imm_size == 0 && inter->immediateOffset != 0)
		pub->detail->x86.encoding.imm_size = inter->immediateSize;
}